

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O0

timespec __thiscall lrit::TimeStampHeader::getUnix(TimeStampHeader *this)

{
  uint uVar1;
  timespec tVar2;
  runtime_error *this_00;
  long in_RDI;
  uint32_t millis;
  uint16_t days;
  timespec ts;
  int *in_stack_00000120;
  char (*in_stack_00000128) [2];
  char (*in_stack_00000130) [90];
  char (*in_stack_00000138) [53];
  string local_40 [32];
  uint local_20;
  ushort local_1a;
  ulong local_10;
  ulong local_8;
  
  memset(&local_10,0,0x10);
  local_1a = *(ushort *)(in_RDI + 5) << 8 | *(ushort *)(in_RDI + 5) >> 8;
  uVar1 = *(uint *)(in_RDI + 7);
  local_20 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  if ((local_1a != 0) || (local_20 != 0)) {
    if (local_1a < 0x111f) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      util::str<char[53],char[90],char[2],int>
                (in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000120);
      std::runtime_error::runtime_error(this_00,local_40);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_10 = (ulong)((local_1a - 0x111f) * 0x15180 + local_20 / 1000);
    local_8 = (ulong)((local_20 % 1000) * 1000000);
  }
  tVar2.tv_nsec = local_8;
  tVar2.tv_sec = local_10;
  return tVar2;
}

Assistant:

struct timespec TimeStampHeader::getUnix() const {
  struct timespec ts{0, 0};
  uint16_t days = __builtin_bswap16(*reinterpret_cast<const uint16_t*>(&ccsds[1]));
  uint32_t millis = __builtin_bswap32(*reinterpret_cast<const uint32_t*>(&ccsds[3]));
  if (days > 0 || millis > 0) {
    ASSERT(days >= ccsdsToUnixDaysOffset);
    ts.tv_sec = ((days - ccsdsToUnixDaysOffset) * 24 * 60 * 60) + (millis / 1000);
    ts.tv_nsec = (millis % 1000) * 1000 * 1000;
  }
  return ts;
}